

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void cubeb_async_log(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char msg [256];
  va_list args;
  undefined1 auStackY_1d8 [8];
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  char local_128 [80];
  char *in_stack_ffffffffffffff28;
  cubeb_async_logger *in_stack_ffffffffffffff30;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_8;
  
  local_18 = auStackY_1d8;
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
    local_20 = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 8;
    local_1d0 = in_RSI;
    local_1c8 = in_RDX;
    local_1c0 = in_RCX;
    local_1b8 = in_R8;
    local_1b0 = in_R9;
    local_8 = in_RDI;
    vsnprintf(local_128,0x100,in_RDI,&local_28);
    cubeb_async_logger::get();
    cubeb_async_logger::push(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

void
cubeb_async_log(char const * fmt, ...)
{
  if (!g_cubeb_log_callback) {
    return;
  }
  // This is going to copy a 256 bytes array around, which is fine.
  // We don't want to allocate memory here, because this is made to
  // be called from a real-time callback.
  va_list args;
  va_start(args, fmt);
  char msg[CUBEB_LOG_MESSAGE_MAX_SIZE];
  vsnprintf(msg, CUBEB_LOG_MESSAGE_MAX_SIZE, fmt, args);
  cubeb_async_logger::get().push(msg);
  va_end(args);
}